

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Tracks::Parse(Tracks *this)

{
  IMkvReader *pReader;
  long lVar1;
  Track **ppTVar2;
  long lVar3;
  ulong uVar4;
  Tracks *this_00;
  long lVar5;
  bool bVar6;
  longlong pos;
  longlong size;
  longlong id;
  long local_50;
  long local_48;
  long local_40;
  Tracks *local_38;
  
  if (this->m_trackEntries != (Track **)0x0) {
    __assert_fail("m_trackEntries == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x162b,"long mkvparser::Tracks::Parse()");
  }
  if (this->m_trackEntriesEnd != (Track **)0x0) {
    __assert_fail("m_trackEntriesEnd == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x162c,"long mkvparser::Tracks::Parse()");
  }
  local_50 = this->m_start;
  lVar5 = this->m_size;
  pReader = this->m_pSegment->m_pReader;
  bVar6 = lVar5 == 0;
  if (0 < lVar5) {
    lVar5 = lVar5 + local_50;
    uVar4 = 0;
    local_38 = this;
    do {
      lVar1 = ParseElementHeader(pReader,&local_50,lVar5,&local_40,&local_48);
      if (lVar1 < 0) {
        return lVar1;
      }
      if (local_48 != 0) {
        if (local_40 == 0xae) {
          if (0x7ffffffe < (long)uVar4) {
            return -1;
          }
          uVar4 = uVar4 + 1;
        }
        local_50 = local_48 + local_50;
        if (lVar5 < local_50) {
          return -2;
        }
      }
    } while (local_50 < lVar5);
    if (local_50 != lVar5) {
      return -2;
    }
    if ((long)uVar4 < 1) {
      return 0;
    }
    ppTVar2 = (Track **)
              operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 << 3,(nothrow_t *)&std::nothrow);
    local_38->m_trackEntries = ppTVar2;
    if (ppTVar2 == (Track **)0x0) {
      return -1;
    }
    local_38->m_trackEntriesEnd = ppTVar2;
    local_50 = local_38->m_start;
    if (local_50 < lVar5) {
      this_00 = local_38;
      do {
        lVar1 = local_50;
        lVar3 = ParseElementHeader(pReader,&local_50,lVar5,&local_40,&local_48);
        if (lVar3 < 0) {
          return lVar3;
        }
        lVar3 = local_50;
        if (local_48 != 0) {
          lVar3 = local_50 + local_48;
          if (lVar5 < lVar3) {
            __assert_fail("payload_stop <= stop",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1668,"long mkvparser::Tracks::Parse()");
          }
          if (local_40 == 0xae) {
            ppTVar2 = this_00->m_trackEntriesEnd;
            *ppTVar2 = (Track *)0x0;
            lVar1 = ParseTrackEntry(this_00,local_50,local_48,lVar1,lVar3 - lVar1,ppTVar2);
            if (lVar1 != 0) {
              return lVar1;
            }
            this_00 = local_38;
            if (*ppTVar2 != (Track *)0x0) {
              local_38->m_trackEntriesEnd = local_38->m_trackEntriesEnd + 1;
            }
          }
        }
        local_50 = lVar3;
      } while (local_50 < lVar5);
    }
    bVar6 = local_50 == lVar5;
  }
  return (ulong)bVar6 * 2 + -2;
}

Assistant:

long Tracks::Parse() {
  assert(m_trackEntries == NULL);
  assert(m_trackEntriesEnd == NULL);

  const long long stop = m_start + m_size;
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long count = 0;
  long long pos = m_start;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvTrackEntry) {
      ++count;
      if (count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (count <= 0)
    return 0;  // success

  m_trackEntries = new (std::nothrow) Track*[static_cast<size_t>(count)];

  if (m_trackEntries == NULL)
    return -1;

  m_trackEntriesEnd = m_trackEntries;

  pos = m_start;

  while (pos < stop) {
    const long long element_start = pos;

    long long id, payload_size;

    const long status =
        ParseElementHeader(pReader, pos, stop, id, payload_size);

    if (status < 0)  // error
      return status;

    if (payload_size == 0)  // weird
      continue;

    const long long payload_stop = pos + payload_size;
    assert(payload_stop <= stop);  // checked in ParseElement

    const long long element_size = payload_stop - element_start;

    if (id == libwebm::kMkvTrackEntry) {
      Track*& pTrack = *m_trackEntriesEnd;
      pTrack = NULL;

      const long status = ParseTrackEntry(pos, payload_size, element_start,
                                          element_size, pTrack);
      if (status)
        return status;

      if (pTrack)
        ++m_trackEntriesEnd;
    }

    pos = payload_stop;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}